

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase495::run(TestCase495 *this)

{
  int iVar1;
  AsyncIoProvider *pAVar2;
  undefined4 extraout_var;
  NetworkAddress *pNVar3;
  void *pvVar4;
  Own<kj::ConnectionReceiver> local_120;
  Promise<kj::Own<kj::AsyncIoStream>_> local_110;
  Own<kj::AsyncIoStream> local_100;
  Type local_f0;
  undefined1 local_e8 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:508:3)>
  _kjDefer508;
  Fault f_1;
  Type TStack_c8;
  SyscallResult _kjSyscallResult_1;
  undefined1 local_c0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:506:3)>
  _kjDefer506;
  Fault f;
  SyscallResult local_a0;
  undefined1 local_9c [4];
  SyscallResult _kjSyscallResult;
  int originalDirFd;
  Own<kj::ConnectionReceiver> listener;
  undefined8 local_80;
  Promise<kj::Own<kj::NetworkAddress>_> local_78;
  undefined1 local_68 [8];
  Own<kj::NetworkAddress> addr;
  Network *network;
  AsyncIoContext ioContext;
  TestCase495 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar2 = Own<kj::AsyncIoProvider>::operator->
                     ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  iVar1 = (*pAVar2->_vptr_AsyncIoProvider[3])();
  StringPtr::StringPtr((StringPtr *)&listener.ptr,"unix-abstract:foo");
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&local_78,(undefined8 *)CONCAT44(extraout_var,iVar1),listener.ptr,local_80,0);
  Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)local_68,&local_78);
  Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_78);
  pNVar3 = Own<kj::NetworkAddress>::operator->((Own<kj::NetworkAddress> *)local_68);
  (*pNVar3->_vptr_NetworkAddress[1])(&_kjSyscallResult);
  f.exception = (Exception *)local_9c;
  local_a0 = _::Debug::syscall<kj::(anonymous_namespace)::TestCase495::run()::__0>
                       ((anon_class_8_1_5e8efcfa *)&f,false);
  pvVar4 = _::Debug::SyscallResult::operator_cast_to_void_(&local_a0);
  if (pvVar4 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_a0);
    _::Debug::Fault::Fault
              ((Fault *)&_kjDefer506.canceled,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1f9,iVar1,"originalDirFd = open(\".\", O_RDONLY | O_DIRECTORY | O_CLOEXEC)","");
    _::Debug::Fault::fatal((Fault *)&_kjDefer506.canceled);
  }
  TStack_c8.originalDirFd = (int *)local_9c;
  defer<kj::(anonymous_namespace)::TestCase495::run()::__1>((kj *)local_c0,&stack0xffffffffffffff38)
  ;
  f_1.exception._4_4_ =
       _::Debug::syscall<kj::(anonymous_namespace)::TestCase495::run()::__2>
                 ((anon_class_1_0_00000001 *)((long)&f_1.exception + 3),false);
  pvVar4 = _::Debug::SyscallResult::operator_cast_to_void_
                     ((SyscallResult *)((long)&f_1.exception + 4));
  if (pvVar4 != (void *)0x0) {
    local_f0.originalDirFd = (int *)local_9c;
    defer<kj::(anonymous_namespace)::TestCase495::run()::__3>((kj *)local_e8,&local_f0);
    pNVar3 = Own<kj::NetworkAddress>::operator->((Own<kj::NetworkAddress> *)local_68);
    (**pNVar3->_vptr_NetworkAddress)(&local_120);
    mv<kj::Own<kj::ConnectionReceiver>>((Own<kj::ConnectionReceiver> *)&_kjSyscallResult);
    Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::ConnectionReceiver>>
              ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_110,&local_120);
    Promise<kj::Own<kj::AsyncIoStream>_>::wait
              ((Promise<kj::Own<kj::AsyncIoStream>_> *)&local_100,&local_110);
    Own<kj::AsyncIoStream>::~Own(&local_100);
    Promise<kj::Own<kj::AsyncIoStream>_>::~Promise(&local_110);
    Promise<kj::Own<kj::AsyncIoStream>_>::~Promise
              ((Promise<kj::Own<kj::AsyncIoStream>_> *)&local_120);
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:508:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:508:3)>
                 *)local_e8);
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:506:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:506:3)>
                 *)local_c0);
    Own<kj::ConnectionReceiver>::~Own((Own<kj::ConnectionReceiver> *)&_kjSyscallResult);
    Own<kj::NetworkAddress>::~Own((Own<kj::NetworkAddress> *)local_68);
    AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&network);
    return;
  }
  iVar1 = _::Debug::SyscallResult::getErrorNumber((SyscallResult *)((long)&f_1.exception + 4));
  _::Debug::Fault::Fault
            ((Fault *)&_kjDefer508.canceled,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
             ,0x1fb,iVar1,"chdir(\"/\")","");
  _::Debug::Fault::fatal((Fault *)&_kjDefer508.canceled);
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<NetworkAddress> addr = network.parseAddress("unix-abstract:foo").wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  int originalDirFd;
  KJ_SYSCALL(originalDirFd = open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_DEFER(close(originalDirFd));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}